

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

bool __thiscall
Hpipe::CppEmitter::bench
          (CppEmitter *this,
          vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *tds)

{
  pointer pTVar1;
  pointer pcVar2;
  size_type sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  ostream *poVar6;
  StreamSep *pSVar7;
  undefined1 uVar8;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type sVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  TrainingData *td;
  pointer pTVar13;
  allocator local_139a;
  allocator local_1399;
  string local_1398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1368;
  StreamSepMaker ns;
  string local_12c8;
  StreamSepMaker ss;
  string gpp;
  string local_11d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  string local_1198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  string local_1158;
  string local_1138;
  StreamSep local_1118;
  StreamSep local_10d0;
  StreamSep local_1088;
  StreamSep local_1040;
  StreamSep local_ff8;
  StreamSep local_fb0;
  StreamSep local_f68;
  StreamSep local_f20;
  StreamSep local_ed8;
  StreamSep local_e90;
  StreamSep local_e48;
  StreamSep local_e00;
  StreamSep local_db8;
  StreamSep local_d70;
  StreamSep local_d28;
  StreamSep local_ce0;
  StreamSep local_c98;
  StreamSep local_c50;
  StreamSep local_c08;
  StreamSep local_bc0;
  StreamSep local_b78;
  StreamSep local_b30;
  StreamSep local_ae8;
  StreamSep local_aa0;
  StreamSep local_a58;
  StreamSep local_a10;
  StreamSep local_9c8;
  StreamSep local_980;
  StreamSep local_938;
  StreamSep local_8f0;
  StreamSep local_8a8;
  StreamSep local_860;
  StreamSep local_818;
  StreamSep local_7d0;
  StreamSep local_788;
  StreamSep local_740;
  StreamSep local_6f8;
  StreamSep local_6b0;
  StreamSep local_668;
  StreamSep local_620;
  StreamSep local_5d8;
  StreamSep local_590;
  StreamSep local_548;
  StreamSep local_500;
  StreamSep local_4b8;
  StreamSep local_470;
  StreamSep local_428;
  StreamSep local_3e0;
  StreamSep local_398;
  StreamSep local_350;
  StreamSep local_308;
  StreamSep local_2c0;
  StreamSep local_278;
  ofstream fout;
  
  std::ofstream::ofstream(&fout,"bench.cpp",_S_out);
  ns.stream = (TS *)&ns.first_beg._M_string_length;
  ns.first_beg._M_dataplus._M_p = (pointer)0x0;
  ns.first_beg._M_string_length._0_1_ = 0;
  gpp._M_dataplus._M_p = (pointer)&gpp.field_2;
  gpp._M_string_length = 0;
  gpp.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_1398,"\n",(allocator *)&local_12c8);
  local_1378._M_allocated_capacity = (size_type)&local_1368;
  local_1378._8_8_ = 0;
  local_1368._M_local_buf[0] = '\0';
  StreamSepMaker::StreamSepMaker
            (&ss,(TS *)&fout,(string *)&ns,&gpp,&local_1398,(string *)&local_1378);
  std::__cxx11::string::~string((string *)local_1378._M_local_buf);
  std::__cxx11::string::~string((string *)&local_1398);
  std::__cxx11::string::~string((string *)&gpp);
  std::__cxx11::string::~string((string *)&ns);
  std::__cxx11::string::string((string *)&gpp,"    ",&local_1399);
  local_1398._M_dataplus._M_p = (pointer)&local_1398.field_2;
  local_1398._M_string_length = 0;
  local_1398.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_1378._M_local_buf,"\n",&local_139a);
  local_12c8._M_dataplus._M_p = (pointer)&local_12c8.field_2;
  local_12c8._M_string_length = 0;
  local_12c8.field_2._M_local_buf[0] = '\0';
  StreamSepMaker::StreamSepMaker(&ns,(TS *)&fout,&gpp,&local_1398,(string *)&local_1378,&local_12c8)
  ;
  std::__cxx11::string::~string((string *)&local_12c8);
  std::__cxx11::string::~string((string *)local_1378._M_local_buf);
  std::__cxx11::string::~string((string *)&local_1398);
  std::__cxx11::string::~string((string *)&gpp);
  StreamSepMaker::operator<<(&local_398,&ss,(char (*) [31])"#include <Hpipe/CbStringPtr.h>");
  StreamSep::~StreamSep(&local_398);
  StreamSepMaker::operator<<(&local_3e0,&ss,(char (*) [25])"#include <Hpipe/Print.h>");
  StreamSep::~StreamSep(&local_3e0);
  StreamSepMaker::operator<<(&local_428,&ss,(char (*) [20])"#include <iostream>");
  StreamSep::~StreamSep(&local_428);
  StreamSepMaker::operator<<(&local_470,&ss,(char (*) [19])"#include <sstream>");
  StreamSep::~StreamSep(&local_470);
  StreamSepMaker::operator<<(&local_4b8,&ss,(char (*) [17])"#include <ctime>");
  StreamSep::~StreamSep(&local_4b8);
  StreamSepMaker::operator<<(&local_500,&ss,(char (*) [1])0x1760d4);
  StreamSep::~StreamSep(&local_500);
  StreamSepMaker::operator<<
            (&local_548,&ss,(char (*) [40])"#define HPIPE_DEFINITION_PREFIX Bench::");
  StreamSep::~StreamSep(&local_548);
  StreamSepMaker::operator<<(&local_590,&ss,(char (*) [1])0x1760d4);
  StreamSep::~StreamSep(&local_590);
  write_preliminaries(this,&ss);
  StreamSepMaker::operator<<(&local_5d8,&ss,(char (*) [1])0x1760d4);
  StreamSep::~StreamSep(&local_5d8);
  StreamSepMaker::operator<<(&local_620,&ss,(char (*) [15])"struct Bench {");
  StreamSep::~StreamSep(&local_620);
  StreamSepMaker::operator<<
            (&local_668,&ss,
             (char (*) [107])
             "    void exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display );"
            );
  StreamSep::~StreamSep(&local_668);
  write_declarations(this,&ns);
  StreamSepMaker::operator<<(&local_6b0,&ss,(char (*) [27])"    std::ostringstream os;");
  StreamSep::~StreamSep(&local_6b0);
  StreamSepMaker::operator<<(&local_6f8,&ss,(char (*) [26])"    HpipeData hpipe_data;");
  StreamSep::~StreamSep(&local_6f8);
  StreamSepMaker::operator<<(&local_740,&ss,(char (*) [22])"    unsigned cpt = 0;");
  StreamSep::~StreamSep(&local_740);
  StreamSepMaker::operator<<(&local_788,&ss,(char (*) [3])"};");
  StreamSep::~StreamSep(&local_788);
  StreamSepMaker::operator<<
            (&local_7d0,&ss,
             (char (*) [111])
             "void Bench::exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display ) {"
            );
  StreamSep::~StreamSep(&local_7d0);
  switch(this->buffer_type) {
  case 0:
    StreamSepMaker::operator<<
              (&local_818,&ns,(char (*) [49])"Hpipe::Buffer *buf = Hpipe::Buffer::New( size );");
    StreamSep::~StreamSep(&local_818);
    StreamSepMaker::operator<<(&local_860,&ns,(char (*) [33])"memcpy( buf->data, data, size );");
    StreamSep::~StreamSep(&local_860);
    StreamSepMaker::operator<<(&local_8a8,&ns,(char (*) [18])"buf->used = size;");
    StreamSep::~StreamSep(&local_8a8);
    StreamSepMaker::operator<<(&local_8f0,&ns,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_8f0);
    StreamSepMaker::operator<<
              (&local_938,&ns,(char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_938);
    StreamSepMaker::operator<<
              (&local_980,&ns,(char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_980);
    StreamSepMaker::operator<<(&local_9c8,&ns,(char (*) [27])"    parse( buf, 0, size );");
    StreamSep::~StreamSep(&local_9c8);
    StreamSepMaker::operator<<(&local_a10,&ns,(char (*) [2])0x178092);
    StreamSep::~StreamSep(&local_a10);
    StreamSepMaker::operator<<(&local_a58,&ns,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_a58);
    pSVar7 = &local_278;
    StreamSepMaker::operator<<(pSVar7,&ns,(char (*) [30])0x177316);
    break;
  case 1:
    StreamSepMaker::operator<<
              (&local_aa0,&ns,(char (*) [49])"Hpipe::Buffer *buf = Hpipe::Buffer::New( size );");
    StreamSep::~StreamSep(&local_aa0);
    StreamSepMaker::operator<<(&local_ae8,&ns,(char (*) [33])"memcpy( buf->data, data, size );");
    StreamSep::~StreamSep(&local_ae8);
    StreamSepMaker::operator<<(&local_b30,&ns,(char (*) [18])"buf->used = size;");
    StreamSep::~StreamSep(&local_b30);
    StreamSepMaker::operator<<(&local_b78,&ns,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_b78);
    StreamSepMaker::operator<<
              (&local_bc0,&ns,(char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_bc0);
    StreamSepMaker::operator<<
              (&local_c08,&ns,(char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_c08);
    StreamSepMaker::operator<<(&local_c50,&ns,(char (*) [24])"    parse( buf, true );");
    StreamSep::~StreamSep(&local_c50);
    StreamSepMaker::operator<<(&local_c98,&ns,(char (*) [2])0x178092);
    StreamSep::~StreamSep(&local_c98);
    StreamSepMaker::operator<<(&local_ce0,&ns,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_ce0);
    pSVar7 = &local_2c0;
    StreamSepMaker::operator<<(pSVar7,&ns,(char (*) [30])0x177316);
    break;
  case 2:
    StreamSepMaker::operator<<(&local_d28,&ns,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_d28);
    StreamSepMaker::operator<<
              (&local_d70,&ns,(char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_d70);
    StreamSepMaker::operator<<
              (&local_db8,&ns,(char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_db8);
    StreamSepMaker::operator<<(&local_e00,&ns,(char (*) [36])"    parse( data, data - 1 + size );");
    StreamSep::~StreamSep(&local_e00);
    StreamSepMaker::operator<<(&local_e48,&ns,(char (*) [2])0x178092);
    StreamSep::~StreamSep(&local_e48);
    pSVar7 = &local_308;
    StreamSepMaker::operator<<(pSVar7,&ns,(char (*) [24])"auto t1 = std::clock();");
    break;
  case 3:
    StreamSepMaker::operator<<(&local_e90,&ns,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_e90);
    StreamSepMaker::operator<<
              (&local_ed8,&ns,(char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_ed8);
    StreamSepMaker::operator<<
              (&local_f20,&ns,(char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_f20);
    StreamSepMaker::operator<<(&local_f68,&ns,(char (*) [19])"    parse( data );");
    StreamSep::~StreamSep(&local_f68);
    StreamSepMaker::operator<<(&local_fb0,&ns,(char (*) [2])0x178092);
    StreamSep::~StreamSep(&local_fb0);
    pSVar7 = &local_350;
    StreamSepMaker::operator<<(pSVar7,&ns,(char (*) [24])"auto t1 = std::clock();");
    break;
  default:
    goto switchD_0015304d_default;
  }
  StreamSep::~StreamSep(pSVar7);
switchD_0015304d_default:
  StreamSepMaker::operator<<(&local_ff8,&ss,(char (*) [19])"    if ( display )");
  StreamSep::~StreamSep(&local_ff8);
  StreamSepMaker::operator<<
            (&local_1040,&ss,
             (char (*) [107])
             "        std::cout << name << \", \" << display << \" -> \" << double( t1 - t0 ) / CLOCKS_PER_SEC << std::endl;"
            );
  StreamSep::~StreamSep(&local_1040);
  StreamSepMaker::operator<<(&local_1088,&ss,(char (*) [2])0x178092);
  StreamSep::~StreamSep(&local_1088);
  write_definitions(this,&ss);
  StreamSepMaker::operator<<(&local_10d0,&ss,(char (*) [36])"int main( int argc, char **argv ) {");
  StreamSep::~StreamSep(&local_10d0);
  pTVar1 = (tds->
           super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar13 = (tds->
                 super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                 )._M_impl.super__Vector_impl_data._M_start; pTVar13 != pTVar1;
      pTVar13 = pTVar13 + 1) {
    poVar6 = std::operator<<(ss.stream,"    static unsigned char name_");
    poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
    std::operator<<(poVar6,"[] = { ");
    pcVar2 = (pTVar13->name)._M_dataplus._M_p;
    sVar3 = (pTVar13->name)._M_string_length;
    for (sVar11 = 0; sVar3 != sVar11; sVar11 = sVar11 + 1) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)ss.stream,(int)pcVar2[sVar11]);
      std::operator<<(poVar6,",");
    }
    std::operator<<(ss.stream," 0 };\n");
    poVar6 = std::operator<<(ss.stream,"    static unsigned char inp_");
    poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
    std::operator<<(poVar6,"[] = { ");
    pcVar2 = (pTVar13->inp)._M_dataplus._M_p;
    sVar3 = (pTVar13->inp)._M_string_length;
    for (sVar11 = 0; sVar3 != sVar11; sVar11 = sVar11 + 1) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)ss.stream,(int)pcVar2[sVar11]);
      std::operator<<(poVar6,",");
    }
    std::operator<<(ss.stream," 0 };\n");
    poVar6 = std::operator<<(ss.stream,"    static double freq_");
    poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
    std::operator<<(poVar6," = ");
    poVar6 = std::ostream::_M_insert<double>(pTVar13->freq);
    std::operator<<(poVar6,";\n");
  }
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(tds->
              super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  for (paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(tds->
                    super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                    )._M_impl.super__Vector_impl_data._M_start; paVar12 != paVar4;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar12 + 0x48)) {
    StreamSepMaker::operator<<((StreamSep *)&gpp,&ss,(char (*) [24])"    Bench().exec( name_");
    local_1398._M_dataplus._M_p = (pointer)paVar12;
    pSVar7 = StreamSep::operator<<((StreamSep *)&gpp,(TrainingData **)&local_1398);
    pSVar7 = StreamSep::operator<<(pSVar7,(char (*) [7])", inp_");
    local_1378._M_allocated_capacity = (size_type)paVar12;
    pSVar7 = StreamSep::operator<<(pSVar7,(TrainingData **)&local_1378._M_allocated_capacity);
    pSVar7 = StreamSep::operator<<(pSVar7,(char (*) [3])0x1795f5);
    local_12c8._M_dataplus._M_p = *(pointer *)(paVar12->_M_local_buf + 0x30);
    pSVar7 = StreamSep::operator<<(pSVar7,(unsigned_long *)&local_12c8);
    StreamSep::operator<<(pSVar7,(char (*) [30])", argc > 1 ? argv[ 1 ] : 0 );");
    StreamSep::~StreamSep((StreamSep *)&gpp);
  }
  StreamSepMaker::operator<<(&local_1118,&ss,(char (*) [2])0x178092);
  StreamSep::~StreamSep(&local_1118);
  std::ofstream::close();
  std::__cxx11::string::string
            ((string *)&gpp,"g++ -O6 -g3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp",
             (allocator *)&local_1398);
  psVar9 = &gpp;
  std::__cxx11::string::string((string *)&local_1138,(string *)psVar9);
  bVar5 = anon_unknown_12::_exec(&local_1138,SUB81(psVar9,0));
  if (bVar5) {
    uVar8 = 0x5b;
    std::__cxx11::string::string
              ((string *)&local_1158,"./bench \'without profile\'",(allocator *)&local_1398);
    bVar5 = anon_unknown_12::_exec(&local_1158,(bool)uVar8);
    if (bVar5) {
      pbVar10 = &gpp;
      std::operator+(&local_1178,pbVar10," -fprofile-generate");
      bVar5 = anon_unknown_12::_exec(&local_1178,SUB81(pbVar10,0));
      if (bVar5) {
        uVar8 = 0xdf;
        std::__cxx11::string::string
                  ((string *)&local_1198,"./bench",(allocator *)local_1378._M_local_buf);
        bVar5 = anon_unknown_12::_exec(&local_1198,(bool)uVar8);
        if (bVar5) {
          pbVar10 = &gpp;
          std::operator+(&local_11b8,pbVar10," -fprofile-use");
          bVar5 = anon_unknown_12::_exec(&local_11b8,SUB81(pbVar10,0));
          if (bVar5) {
            uVar8 = 0x75;
            std::__cxx11::string::string
                      ((string *)&local_11d8,"./bench \'with profile\'",(allocator *)&local_12c8);
            bVar5 = anon_unknown_12::_exec(&local_11d8,(bool)uVar8);
            std::__cxx11::string::~string((string *)&local_11d8);
          }
          else {
            bVar5 = false;
          }
          std::__cxx11::string::~string((string *)&local_11b8);
        }
        else {
          bVar5 = false;
        }
        std::__cxx11::string::~string((string *)&local_1198);
      }
      else {
        bVar5 = false;
      }
      std::__cxx11::string::~string((string *)&local_1178);
    }
    else {
      bVar5 = false;
    }
    std::__cxx11::string::~string((string *)&local_1158);
  }
  else {
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&local_1138);
  std::__cxx11::string::~string((string *)&gpp);
  StreamSepMaker::~StreamSepMaker(&ns);
  StreamSepMaker::~StreamSepMaker(&ss);
  std::ofstream::~ofstream(&fout);
  return bVar5;
}

Assistant:

bool CppEmitter::bench(const std::vector<Lexer::TrainingData> &tds) {
    std::ofstream fout( "bench.cpp" );
    StreamSepMaker ss( fout );
    StreamSepMaker ns( fout, "    " );
    ss << "#include <Hpipe/CbStringPtr.h>";
    ss << "#include <Hpipe/Print.h>";
    ss << "#include <iostream>";
    ss << "#include <sstream>";
    ss << "#include <ctime>";    
    ss << "";
    ss << "#define HPIPE_DEFINITION_PREFIX Bench::";
    ss << "";
    write_preliminaries( ss );
    ss << "";
    ss << "struct Bench {";
    ss << "    void exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display );";
    write_declarations( ns );
    ss << "    std::ostringstream os;";
    ss << "    HpipeData hpipe_data;";
    ss << "    unsigned cpt = 0;";
    ss << "};";

    ss << "void Bench::exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display ) {";
    switch ( buffer_type ) {
    case BT_HPIPE_CB_STRING_PTR:
        ns << "Hpipe::Buffer *buf = Hpipe::Buffer::New( size );";
        ns << "memcpy( buf->data, data, size );";
        ns << "buf->used = size;";
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( buf, 0, size );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        ns << "HPIPE_BUFF_T::dec_ref( buf );";
        break;
    case BT_HPIPE_BUFFER:
        ns << "Hpipe::Buffer *buf = Hpipe::Buffer::New( size );";
        ns << "memcpy( buf->data, data, size );";
        ns << "buf->used = size;";
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( buf, true );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        ns << "HPIPE_BUFF_T::dec_ref( buf );";
        break;
    case BT_BEG_END:
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( data, data - 1 + size );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        break;
    case BT_C_STR:
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( data );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        break;
    }
    ss << "    if ( display )";
    ss << "        std::cout << name << \", \" << display << \" -> \" << double( t1 - t0 ) / CLOCKS_PER_SEC << std::endl;";
    ss << "}";

    write_definitions( ss );

    ss << "int main( int argc, char **argv ) {";
    for( const Lexer::TrainingData &td : tds ) {
        *ss.stream << "    static unsigned char name_" << &td << "[] = { "; for( char c : td.name ) *ss.stream << (int)c << ","; *ss.stream << " 0 };\n";
        *ss.stream << "    static unsigned char inp_"  << &td << "[] = { "; for( char c : td.inp  ) *ss.stream << (int)c << ","; *ss.stream << " 0 };\n";
        *ss.stream << "    static double freq_"        << &td << " = " << td.freq << ";\n";
    }
    for( const Lexer::TrainingData &td : tds )
        ss << "    Bench().exec( name_" << &td << ", inp_" << &td << ", " << td.inp.size() << ", argc > 1 ? argv[ 1 ] : 0 );";
    ss << "}";
    fout.close();

    bool clang = false;
    if ( clang ) {
        std::string gpp = "clang++ -O3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
        return _exec( gpp ) && _exec( "echo without profile", false ) && _exec( "./bench 'without profile'" ) &&
               _exec( gpp + " -fprofile-instr-generate" ) && _exec( "./bench -nodisp" ) &&
               _exec( "llvm-profdata-3.8 merge -output=default.profdata default.profraw" ) &&
               _exec( gpp + " -fprofile-instr-use"      ) && _exec( "./bench 'with profile'" );
    }

    //std::string gpp = "g++ -O6 -g3 -fno-reorder-blocks -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
    std::string gpp = "g++ -O6 -g3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
    return _exec( gpp ) && _exec( "./bench 'without profile'" )
        && _exec( gpp + " -fprofile-generate" ) && _exec( "./bench" )
        && _exec( gpp + " -fprofile-use"      ) && _exec( "./bench 'with profile'" )
            ; // -fno-reorder-blocks-and-partition
}